

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ReduceMaxLayerParams::InternalSwap
          (ReduceMaxLayerParams *this,ReduceMaxLayerParams *other)

{
  ReduceMaxLayerParams *other_local;
  ReduceMaxLayerParams *this_local;
  
  google::protobuf::RepeatedField<long>::InternalSwap(&this->axes_,&other->axes_);
  std::swap<bool>(&this->keepdims_,&other->keepdims_);
  std::swap<bool>(&this->reduceall_,&other->reduceall_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void ReduceMaxLayerParams::InternalSwap(ReduceMaxLayerParams* other) {
  axes_.InternalSwap(&other->axes_);
  std::swap(keepdims_, other->keepdims_);
  std::swap(reduceall_, other->reduceall_);
  std::swap(_cached_size_, other->_cached_size_);
}